

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

iterator divsufsortxx::helper::
         median3<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                   (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator v1,
                   iterator v2,iterator v3)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  pos_type pVar3;
  BitmapArray<long> *pBVar4;
  pos_type pVar5;
  BitmapArray<long> *pBVar6;
  BitmapArray<long> *pBVar7;
  pos_type pVar8;
  iterator iVar9;
  pos_type local_58;
  BitmapArray<long> *local_50;
  
  local_58 = v1.pos_;
  local_50 = v1.array_;
  pVar8 = v3.pos_;
  pBVar7 = v3.array_;
  pVar3 = v2.pos_;
  pBVar4 = v2.array_;
  iVar2 = (*(local_50->super_Bitmap)._vptr_Bitmap[5])();
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var,iVar2) + Td.m_PA.pos_);
  cVar1 = Td.m_Td[CONCAT44(extraout_var_00,iVar2)];
  iVar2 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,pVar3);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var_01,iVar2) + Td.m_PA.pos_);
  pBVar6 = pBVar4;
  pVar5 = pVar3;
  if (Td.m_Td[CONCAT44(extraout_var_02,iVar2)] < cVar1) {
    pBVar6 = local_50;
    pVar5 = local_58;
    local_58 = pVar3;
    local_50 = pBVar4;
  }
  iVar2 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var_03,iVar2) + Td.m_PA.pos_);
  cVar1 = Td.m_Td[CONCAT44(extraout_var_04,iVar2)];
  iVar2 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,pVar8);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var_05,iVar2) + Td.m_PA.pos_);
  if (Td.m_Td[CONCAT44(extraout_var_06,iVar2)] < cVar1) {
    iVar2 = (*(local_50->super_Bitmap)._vptr_Bitmap[5])(local_50,local_58);
    iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                      (Td.m_PA.array_,CONCAT44(extraout_var_07,iVar2) + Td.m_PA.pos_);
    cVar1 = Td.m_Td[CONCAT44(extraout_var_08,iVar2)];
    iVar2 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,pVar8);
    iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                      (Td.m_PA.array_,Td.m_PA.pos_ + CONCAT44(extraout_var_09,iVar2));
    pVar5 = pVar8;
    pBVar6 = pBVar7;
    if (Td.m_Td[CONCAT44(extraout_var_10,iVar2)] < cVar1) {
      pVar5 = local_58;
      pBVar6 = local_50;
    }
  }
  iVar9.pos_ = pVar5;
  iVar9.array_ = pBVar6;
  return iVar9;
}

Assistant:

SAIterator_type median3(const StringIterator_type Td, SAIterator_type v1,
                        SAIterator_type v2, SAIterator_type v3) {
  if (Td[*v1] > Td[*v2]) {
    std::swap(v1, v2);
  }
  if (Td[*v2] > Td[*v3]) {
    if (Td[*v1] > Td[*v3]) {
      return v1;
    } else {
      return v3;
    }
  }
  return v2;
}